

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceOptions::ServiceOptions(ServiceOptions *this,ServiceOptions *from)

{
  void *pvVar1;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ServiceOptions_003b9f18;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  this->deprecated_ = from->deprecated_;
  return;
}

Assistant:

ServiceOptions::ServiceOptions(const ServiceOptions& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  deprecated_ = from.deprecated_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.ServiceOptions)
}